

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.h
# Opt level: O1

void __thiscall submitter::operator()(submitter *this)

{
  function *pfVar1;
  function<void()> afStack_58 [16];
  code *local_48;
  runner local_38;
  
  pfVar1 = (function *)cppcms::service::thread_pool();
  runner::runner(&local_38,this->srv_);
  std::function<void()>::function<runner,void>(afStack_58,&local_38);
  cppcms::thread_pool::post(pfVar1);
  if (local_48 != (code *)0x0) {
    (*local_48)(afStack_58,afStack_58,3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38.command_._M_dataplus._M_p != &local_38.command_.field_2) {
    operator_delete(local_38.command_._M_dataplus._M_p);
  }
  return;
}

Assistant:

void operator()() const
	{
		srv_->thread_pool().post(runner(*srv_));
	}